

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationArrow::paintEvent(NavigationArrow *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  NavigationArrowPrivate *pNVar3;
  QRect QVar4;
  undefined1 local_3c [8];
  QRect r;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  NavigationArrow *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_20,true);
  QVar4 = QWidget::rect(&this->super_QWidget);
  r._0_8_ = QVar4._8_8_;
  local_3c = QVar4._0_8_;
  pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
           ::operator->(&this->d);
  if (pNVar3->direction == Right) {
    pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
             ::operator->(&this->d);
    drawArrow(local_20,(QRect *)local_3c,&pNVar3->color);
  }
  pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
           ::operator->(&this->d);
  if (pNVar3->direction == Left) {
    QPainter::rotate(180.0);
    iVar1 = QRect::width((QRect *)local_3c);
    iVar2 = QRect::height((QRect *)local_3c);
    QPainter::translate(local_20,(double)-iVar1,(double)-iVar2);
    pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
             ::operator->(&this->d);
    drawArrow(local_20,(QRect *)local_3c,&pNVar3->color);
  }
  else {
    pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
             ::operator->(&this->d);
    if (pNVar3->direction == Top) {
      QPainter::rotate(180.0);
      iVar1 = QRect::width((QRect *)local_3c);
      iVar2 = QRect::height((QRect *)local_3c);
      QPainter::translate(local_20,(double)-iVar1,(double)-iVar2);
      pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
               ::operator->(&this->d);
      drawArrow2(local_20,(QRect *)local_3c,&pNVar3->color);
    }
    else {
      pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
               ::operator->(&this->d);
      if (pNVar3->direction == Bottom) {
        pNVar3 = QScopedPointer<QtMWidgets::NavigationArrowPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationArrowPrivate>_>
                 ::operator->(&this->d);
        drawArrow2(local_20,(QRect *)local_3c,&pNVar3->color);
      }
    }
  }
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
NavigationArrow::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	const QRect r = rect();

	if( d->direction == Right )
		drawArrow( &p, r, d->color );
	if( d->direction == Left )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow( &p, r, d->color );
	}
	else if( d->direction == Top )
	{
		p.rotate( 180 );
		p.translate( - r.width(), - r.height() );

		drawArrow2( &p, r, d->color );
	}
	else if( d->direction == Bottom )
		drawArrow2( &p, r, d->color );
}